

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O2

void __thiscall OpenMD::ForceMatrixDecomposition::collectSelfData(ForceMatrixDecomposition *this)

{
  return;
}

Assistant:

void ForceMatrixDecomposition::collectSelfData() {
#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &selfPot[0], N_INTERACTION_FAMILIES,
                  MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);

    MPI_Allreduce(MPI_IN_PLACE, &excludedSelfPot[0], N_INTERACTION_FAMILIES,
                  MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);

    MPI_Allreduce(MPI_IN_PLACE, &selectedSelfPot[0], N_INTERACTION_FAMILIES,
                  MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
#endif
  }